

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::ContainerEqMatcher<std::vector<unsigned_long,std::allocator<unsigned_long>>>::
MatchAndExplain<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (ContainerEqMatcher<std::vector<unsigned_long,std::allocator<unsigned_long>>> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *lhs,MatchResultListener *listener)

{
  ostream *poVar1;
  bool bVar2;
  int iVar3;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  it_1;
  unsigned_long *puVar4;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  it_2;
  pointer puVar5;
  long lVar6;
  pointer puVar7;
  unsigned_long *puVar8;
  char *pcVar9;
  const_iterator it;
  char *pcVar10;
  
  puVar5 = (lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = *(unsigned_long **)this;
  puVar8 = *(unsigned_long **)(this + 8);
  if (((long)puVar7 - (long)puVar5 != (long)puVar8 - (long)puVar4) ||
     ((bVar2 = true, puVar7 != puVar5 &&
      (iVar3 = bcmp(puVar5,puVar4,(long)puVar7 - (long)puVar5), iVar3 != 0)))) {
    poVar1 = listener->stream_;
    if (poVar1 != (ostream *)0x0) {
      if (puVar5 == puVar7) {
        pcVar10 = "which";
      }
      else {
        bVar2 = false;
        do {
          puVar4 = *(unsigned_long **)this;
          puVar8 = *(unsigned_long **)(this + 8);
          if (puVar4 != puVar8) {
            do {
              if (*puVar4 == *puVar5) {
                if (puVar4 != puVar8) goto LAB_001965aa;
                break;
              }
              puVar4 = puVar4 + 1;
            } while (puVar4 != puVar8);
          }
          if (bVar2) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar1,"which has these unexpected elements: ",0x25);
            bVar2 = true;
          }
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          puVar7 = (lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
LAB_001965aa:
          puVar5 = puVar5 + 1;
        } while (puVar5 != puVar7);
        puVar4 = *(unsigned_long **)this;
        puVar8 = *(unsigned_long **)(this + 8);
        pcVar10 = "which";
        if (bVar2) {
          pcVar10 = ",\nand";
        }
      }
      if (puVar4 != puVar8) {
        bVar2 = false;
        do {
          puVar5 = (lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          puVar7 = (lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if (puVar5 != puVar7) {
            do {
              if (*puVar5 == *puVar4) {
                if (puVar5 != puVar7) goto LAB_00196656;
                break;
              }
              puVar5 = puVar5 + 1;
            } while (puVar5 != puVar7);
          }
          if (bVar2) {
            lVar6 = 2;
            pcVar9 = ", ";
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar10,5);
            lVar6 = 0x27;
            pcVar9 = " doesn\'t have these expected elements: ";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar9,lVar6);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          puVar8 = *(unsigned_long **)(this + 8);
          bVar2 = true;
LAB_00196656:
          puVar4 = puVar4 + 1;
        } while (puVar4 != puVar8);
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }